

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O0

int __thiscall
webrtc::PushResampler<short>::Resample
          (PushResampler<short> *this,short *src,size_t src_length,short *dst,size_t dst_capacity)

{
  ulong samples_per_channel;
  pointer pPVar1;
  pointer psVar2;
  pointer psVar3;
  size_t sVar4;
  size_t dst_length_mono;
  short *deinterleaved [2];
  size_t dst_capacity_mono;
  size_t src_length_mono;
  size_t dst_size_10ms;
  size_t src_size_10ms;
  size_t dst_capacity_local;
  short *dst_local;
  size_t src_length_local;
  short *src_local;
  PushResampler<short> *this_local;
  
  if ((src_length == ((long)this->src_sample_rate_hz_ * this->num_channels_) / 100) &&
     (((long)this->dst_sample_rate_hz_ * this->num_channels_) / 100 <= dst_capacity)) {
    if (this->src_sample_rate_hz_ == this->dst_sample_rate_hz_) {
      memcpy(dst,src,src_length << 1);
      this_local._4_4_ = (int)src_length;
    }
    else if (this->num_channels_ == 2) {
      samples_per_channel = src_length / this->num_channels_;
      deinterleaved[1] = (short *)(dst_capacity / this->num_channels_);
      dst_length_mono =
           (size_t)std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->src_left_);
      deinterleaved[0] =
           std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->src_right_);
      Deinterleave<short>(src,samples_per_channel,this->num_channels_,(short **)&dst_length_mono);
      pPVar1 = std::
               unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
               ::operator->(&this->sinc_resampler_);
      psVar2 = std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->src_left_);
      psVar3 = std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->dst_left_);
      sVar4 = PushSincResampler::Resample
                        (pPVar1,psVar2,samples_per_channel,psVar3,(size_t)deinterleaved[1]);
      pPVar1 = std::
               unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
               ::operator->(&this->sinc_resampler_right_);
      psVar2 = std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->src_right_);
      psVar3 = std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->dst_right_);
      PushSincResampler::Resample(pPVar1,psVar2,samples_per_channel,psVar3,(size_t)deinterleaved[1])
      ;
      dst_length_mono =
           (size_t)std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->dst_left_);
      deinterleaved[0] =
           std::unique_ptr<short[],_std::default_delete<short[]>_>::get(&this->dst_right_);
      Interleave<short>((short **)&dst_length_mono,sVar4,this->num_channels_,dst);
      this_local._4_4_ = (int)sVar4 * (int)this->num_channels_;
    }
    else {
      pPVar1 = std::
               unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
               ::operator->(&this->sinc_resampler_);
      sVar4 = PushSincResampler::Resample(pPVar1,src,src_length,dst,dst_capacity);
      this_local._4_4_ = (int)sVar4;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int PushResampler<T>::Resample(const T* src, size_t src_length, T* dst,
                               size_t dst_capacity) {
  const size_t src_size_10ms = src_sample_rate_hz_ * num_channels_ / 100;
  const size_t dst_size_10ms = dst_sample_rate_hz_ * num_channels_ / 100;
  if (src_length != src_size_10ms || dst_capacity < dst_size_10ms)
    return -1;

  if (src_sample_rate_hz_ == dst_sample_rate_hz_) {
    // The old resampler provides this memcpy facility in the case of matching
    // sample rates, so reproduce it here for the sinc resampler.
    memcpy(dst, src, src_length * sizeof(T));
    return static_cast<int>(src_length);
  }
  if (num_channels_ == 2) {
    const size_t src_length_mono = src_length / num_channels_;
    const size_t dst_capacity_mono = dst_capacity / num_channels_;
    T* deinterleaved[] = {src_left_.get(), src_right_.get()};
    Deinterleave(src, src_length_mono, num_channels_, deinterleaved);

    size_t dst_length_mono =
        sinc_resampler_->Resample(src_left_.get(), src_length_mono,
                                  dst_left_.get(), dst_capacity_mono);
    sinc_resampler_right_->Resample(src_right_.get(), src_length_mono,
                                    dst_right_.get(), dst_capacity_mono);

    deinterleaved[0] = dst_left_.get();
    deinterleaved[1] = dst_right_.get();
    Interleave(deinterleaved, dst_length_mono, num_channels_, dst);
    return static_cast<int>(dst_length_mono * num_channels_);
  } else {
    return static_cast<int>(
        sinc_resampler_->Resample(src, src_length, dst, dst_capacity));
  }
}